

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O3

void Hacl_Bignum256_32_mod_precomp
               (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,uint32_t *a,uint32_t *res)

{
  uint32_t nInv;
  uint32_t *n;
  uint32_t *b;
  uint32_t a_mod [8];
  uint32_t c [16];
  uint32_t local_d8 [8];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint32_t local_78 [18];
  
  n = k->n;
  nInv = k->mu;
  b = k->r2;
  local_d8[4] = 0;
  local_d8[5] = 0;
  local_d8[6] = 0;
  local_d8[7] = 0;
  local_d8[0] = 0;
  local_d8[1] = 0;
  local_d8[2] = 0;
  local_d8[3] = 0;
  local_b8 = *(undefined8 *)a;
  uStack_b0 = *(undefined8 *)(a + 2);
  local_a8 = *(undefined8 *)(a + 4);
  uStack_a0 = *(undefined8 *)(a + 6);
  local_98 = *(undefined8 *)(a + 8);
  uStack_90 = *(undefined8 *)(a + 10);
  local_88 = *(undefined8 *)(a + 0xc);
  uStack_80 = *(undefined8 *)(a + 0xe);
  areduction(n,nInv,(uint32_t *)&local_b8,local_d8);
  local_78[0xc] = 0;
  local_78[0xd] = 0;
  local_78[0xe] = 0;
  local_78[0xf] = 0;
  local_78[8] = 0;
  local_78[9] = 0;
  local_78[10] = 0;
  local_78[0xb] = 0;
  local_78[4] = 0;
  local_78[5] = 0;
  local_78[6] = 0;
  local_78[7] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  Hacl_Bignum256_32_mul(local_d8,b,local_78);
  reduction(n,nInv,local_78,res);
  return;
}

Assistant:

void
Hacl_Bignum256_32_mod_precomp(
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,
  uint32_t *a,
  uint32_t *res
)
{
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k1 = *k;
  bn_slow_precomp(k1.n, k1.mu, k1.r2, a, res);
}